

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder_graph.cc
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
S2Builder::Graph::GetInEdgeIds
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,Graph *this)

{
  EdgeId EVar1;
  iterator iVar2;
  iterator iVar3;
  allocator<int> local_1a;
  undefined1 local_19;
  Graph *local_18;
  Graph *this_local;
  vector<int,_std::allocator<int>_> *in_edge_ids;
  
  local_19 = 0;
  local_18 = this;
  this_local = (Graph *)__return_storage_ptr__;
  EVar1 = num_edges(this);
  std::allocator<int>::allocator(&local_1a);
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,(long)EVar1,&local_1a);
  std::allocator<int>::~allocator(&local_1a);
  iVar2 = std::vector<int,_std::allocator<int>_>::begin(__return_storage_ptr__);
  iVar3 = std::vector<int,_std::allocator<int>_>::end(__return_storage_ptr__);
  std::iota<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar2._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar3._M_current,0);
  iVar2 = std::vector<int,_std::allocator<int>_>::begin(__return_storage_ptr__);
  iVar3 = std::vector<int,_std::allocator<int>_>::end(__return_storage_ptr__);
  std::
  sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,S2Builder::Graph::GetInEdgeIds()const::__0>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar2._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar3._M_current,
             (anon_class_8_1_8991fb9c)this);
  return __return_storage_ptr__;
}

Assistant:

vector<Graph::EdgeId> Graph::GetInEdgeIds() const {
  vector<EdgeId> in_edge_ids(num_edges());
  std::iota(in_edge_ids.begin(), in_edge_ids.end(), 0);
  std::sort(in_edge_ids.begin(), in_edge_ids.end(),
            [this](EdgeId ai, EdgeId bi) {
      return StableLessThan(reverse(edge(ai)), reverse(edge(bi)), ai, bi);
    });
  return in_edge_ids;
}